

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  char *pcVar1;
  byte *pbVar2;
  char *pcVar3;
  byte bVar4;
  char cVar5;
  uint uVar6;
  undefined8 uVar7;
  ushort uVar8;
  ushort uVar9;
  int iVar10;
  BYTE *s;
  ushort *__src;
  char *__dest;
  long lVar11;
  size_t __n;
  BYTE *d_1;
  char *pcVar12;
  ushort *puVar13;
  char *pcVar14;
  char *pcVar15;
  BYTE *s_1;
  ushort *puVar16;
  ulong uVar17;
  BYTE *d_2;
  char *pcVar18;
  BYTE *oCopyLimit;
  int local_38;
  
  iVar10 = -1;
  if (-1 < maxDecompressedSize && source != (char *)0x0) {
    if (maxDecompressedSize == 0) {
      if (compressedSize == 1) {
        iVar10 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar2 = (byte *)(source + compressedSize);
      pcVar3 = dest + (uint)maxDecompressedSize;
      pcVar1 = pcVar3 + -7;
      puVar16 = (ushort *)source;
      __dest = dest;
      do {
        while( true ) {
          __src = (ushort *)((long)puVar16 + 1);
          bVar4 = (byte)*puVar16;
          __n = (size_t)(uint)(bVar4 >> 4);
          if (bVar4 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= __src) ||
             (dest + ((ulong)(uint)maxDecompressedSize - 0x20) < __dest)) goto LAB_0011a47f;
          uVar7 = *(undefined8 *)((long)puVar16 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar7;
          pcVar12 = __dest + __n;
          uVar17 = (ulong)(bVar4 & 0xf);
          puVar16 = (ushort *)((long)__src + __n);
          __src = puVar16 + 1;
          uVar8 = *puVar16;
          pcVar14 = pcVar12 + -(ulong)uVar8;
          if (((uVar17 == 0xf) || (uVar8 < 8)) || (pcVar14 < dest)) goto LAB_0011a52e;
          *(undefined8 *)pcVar12 = *(undefined8 *)pcVar14;
          *(undefined8 *)(pcVar12 + 8) = *(undefined8 *)(pcVar14 + 8);
          *(undefined2 *)(pcVar12 + 0x10) = *(undefined2 *)(pcVar14 + 0x10);
          __dest = pcVar12 + uVar17 + 4;
          puVar16 = __src;
        }
        if (pbVar2 + -0xf <= __src) goto LAB_0011a6a3;
        puVar16 = puVar16 + 1;
        lVar11 = 0;
        puVar13 = __src;
        do {
          __src = (ushort *)((long)puVar13 + 1);
          if (pbVar2 + -0xf < __src) goto LAB_0011a6a3;
          uVar8 = *puVar13;
          lVar11 = lVar11 + (ulong)(byte)uVar8;
          puVar16 = (ushort *)((long)puVar16 + 1);
          puVar13 = __src;
        } while ((ulong)(byte)uVar8 == 0xff);
        if (((lVar11 == -1) || (__n = lVar11 + 0xf, CARRY8((ulong)__dest,__n))) ||
           ((ulong)-(long)puVar16 < __n)) goto LAB_0011a6a3;
LAB_0011a47f:
        pcVar12 = __dest + __n;
        if ((pcVar3 + -0xc < pcVar12) ||
           (puVar16 = (ushort *)((long)__src + __n), pbVar2 + -8 < puVar16)) {
          if (((byte *)((long)__src + __n) == pbVar2) && (pcVar12 <= pcVar3)) {
            memmove(__dest,__src,__n);
            return (int)pcVar12 - (int)dest;
          }
LAB_0011a6a3:
          local_38 = (int)source;
          return ~(uint)__src + local_38;
        }
        do {
          *(undefined8 *)__dest = *(undefined8 *)__src;
          __dest = __dest + 8;
          __src = __src + 4;
        } while (__dest < pcVar12);
        uVar8 = *puVar16;
        __src = puVar16 + 1;
        pcVar14 = pcVar12 + -(ulong)uVar8;
        uVar17 = (ulong)(bVar4 & 0xf);
LAB_0011a52e:
        if ((int)uVar17 == 0xf) {
          lVar11 = 0;
          puVar16 = __src;
          do {
            __src = (ushort *)((long)puVar16 + 1);
            if (pbVar2 + -4 < __src) goto LAB_0011a6a3;
            uVar9 = *puVar16;
            lVar11 = lVar11 + (ulong)(byte)uVar9;
            puVar16 = __src;
          } while ((ulong)(byte)uVar9 == 0xff);
          uVar17 = lVar11 + 0xf;
          if ((lVar11 == -1) || (CARRY8((ulong)pcVar12,uVar17))) goto LAB_0011a6a3;
        }
        if (pcVar14 < dest) goto LAB_0011a6a3;
        if (uVar8 < 8) {
          pcVar12[0] = '\0';
          pcVar12[1] = '\0';
          pcVar12[2] = '\0';
          pcVar12[3] = '\0';
          *pcVar12 = *pcVar14;
          pcVar12[1] = pcVar14[1];
          pcVar12[2] = pcVar14[2];
          pcVar12[3] = pcVar14[3];
          uVar6 = inc32table[uVar8];
          *(undefined4 *)(pcVar12 + 4) = *(undefined4 *)(pcVar14 + uVar6);
          pcVar14 = pcVar14 + ((ulong)uVar6 - (long)dec64table[uVar8]);
        }
        else {
          *(undefined8 *)pcVar12 = *(undefined8 *)pcVar14;
          pcVar14 = pcVar14 + 8;
        }
        __dest = pcVar12 + uVar17 + 4;
        pcVar15 = pcVar12 + 8;
        puVar16 = __src;
        if (pcVar3 + -0xc < __dest) {
          if (pcVar3 + -5 < __dest) goto LAB_0011a6a3;
          pcVar12 = pcVar14;
          pcVar18 = pcVar15;
          if (pcVar15 < pcVar1) {
            do {
              *(undefined8 *)pcVar18 = *(undefined8 *)pcVar12;
              pcVar18 = pcVar18 + 8;
              pcVar12 = pcVar12 + 8;
            } while (pcVar18 < pcVar1);
            pcVar14 = pcVar14 + ((long)pcVar1 - (long)pcVar15);
            pcVar15 = pcVar1;
          }
          for (; pcVar15 < __dest; pcVar15 = pcVar15 + 1) {
            cVar5 = *pcVar14;
            pcVar14 = pcVar14 + 1;
            *pcVar15 = cVar5;
          }
        }
        else {
          *(undefined8 *)pcVar15 = *(undefined8 *)pcVar14;
          if (0x10 < uVar17 + 4) {
            pcVar12 = pcVar12 + 0x10;
            do {
              pcVar14 = pcVar14 + 8;
              *(undefined8 *)pcVar12 = *(undefined8 *)pcVar14;
              pcVar12 = pcVar12 + 8;
            } while (pcVar12 < __dest);
          }
        }
      } while( true );
    }
  }
  return iVar10;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}